

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::GetProgramStack_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,int firstFrame,
          int wholePath)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ssize_t sVar4;
  long lVar5;
  SymbolProperties symProps;
  string binary;
  ostringstream oss;
  Dl_info info;
  void *stackSymbols [256];
  undefined1 local_e98 [80];
  _Alloc_hider local_e48;
  size_type local_e40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38;
  long local_e28;
  int local_e20;
  long local_e18;
  string local_e10;
  string local_df0;
  string local_dd0 [32];
  undefined1 local_db0 [376];
  string local_c38 [32];
  allocator local_838 [2056];
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             "WARNING: The stack trace will not use advanced capabilities because this is a release build.\n"
             ,local_838);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db0);
  iVar2 = backtrace(local_838,0x100);
  local_e18 = (long)iVar2;
  for (lVar5 = (long)(int)this; lVar5 < local_e18; lVar5 = lVar5 + 1) {
    local_e98._0_8_ = local_e98 + 0x10;
    local_e98._8_8_ = 0;
    local_e98[0x10] = '\0';
    local_e98._48_8_ = local_e98 + 0x40;
    local_e98._56_8_ = 0;
    local_e98[0x40] = '\0';
    local_e48._M_p = (pointer)&local_e38;
    local_e40 = 0;
    local_e38._M_local_buf[0] = '\0';
    std::__cxx11::string::assign(local_e98);
    local_e98._32_8_ = (void *)0x0;
    local_e98._40_8_ = (void *)0x0;
    std::__cxx11::string::assign(local_e98 + 0x30);
    anon_unknown_3::SymbolProperties::SetFunction((SymbolProperties *)local_e98,"???");
    local_e28 = -1;
    local_e20 = 0;
    std::__cxx11::string::string((string *)local_c38,(string *)&local_e48);
    std::__cxx11::string::~string((string *)local_c38);
    (anonymous_namespace)::SymbolProperties::GetSourceFile_abi_cxx11_(&local_e10,local_e98);
    std::__cxx11::string::~string((string *)&local_e10);
    local_e98._40_8_ = *(undefined8 *)(local_838 + lVar5 * 8);
    local_e20 = firstFrame;
    iVar2 = dladdr(local_e98._40_8_,local_c38);
    if (((iVar2 != 0) && ((char *)local_c38[0].field_2._0_8_ != (char *)0x0)) &&
       (local_c38[0].field_2._8_8_ != 0)) {
      std::__cxx11::string::assign(local_e98);
      anon_unknown_3::SymbolProperties::SetFunction
                ((SymbolProperties *)local_e98,(char *)local_c38[0].field_2._0_8_);
    }
    *(uint *)(*(_func_int **)(local_db0._0_8_ + -0x18) + (long)(local_db0 + 0x18)) =
         *(uint *)(*(_func_int **)(local_db0._0_8_ + -0x18) + (long)(local_db0 + 0x18)) & 0xffffffb5
         | 8;
    poVar3 = std::ostream::_M_insert<void_const*>(local_db0);
    poVar3 = std::operator<<(poVar3," : ");
    std::__cxx11::string::string(local_dd0,(string *)&local_e48);
    poVar3 = std::operator<<(poVar3,local_dd0);
    poVar3 = std::operator<<(poVar3," [(");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e98,"/proc/self/exe");
    if (bVar1) {
      local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
      local_e10._M_string_length = 0;
      local_e10.field_2._M_local_buf[0] = '\0';
      memset(local_c38,0,0x400);
      sVar4 = readlink("/proc/self/exe",(char *)local_c38,0x400);
      if (0 < sVar4) {
        *(undefined1 *)((long)&local_c38[0]._M_dataplus._M_p + sVar4) = 0;
      }
      std::__cxx11::string::assign((char *)&local_e10);
      anon_unknown_3::SymbolProperties::GetFileName
                (&local_df0,(SymbolProperties *)local_e98,&local_e10);
      std::__cxx11::string::~string((string *)&local_e10);
    }
    else {
      anon_unknown_3::SymbolProperties::GetFileName
                (&local_df0,(SymbolProperties *)local_e98,(string *)local_e98);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_df0);
    poVar3 = std::operator<<(poVar3,") ");
    (anonymous_namespace)::SymbolProperties::GetSourceFile_abi_cxx11_(local_c38,local_e98);
    poVar3 = std::operator<<(poVar3,(string *)local_c38);
    poVar3 = std::operator<<(poVar3,":");
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"]");
    std::__cxx11::string::~string((string *)local_c38);
    std::__cxx11::string::~string((string *)&local_df0);
    std::__cxx11::string::~string(local_dd0);
    std::endl<char,std::char_traits<char>>((ostream *)local_db0);
    anon_unknown_3::SymbolProperties::~SymbolProperties((SymbolProperties *)local_e98);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_c38);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db0);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformationImplementation::GetProgramStack(
      int firstFrame,
      int wholePath)
{
  kwsys_stl::string programStack = ""
#if !defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
    "WARNING: The stack could not be examined "
    "because backtrace is not supported.\n"
#elif !defined(KWSYS_SYSTEMINFORMATION_HAS_DEBUG_BUILD)
    "WARNING: The stack trace will not use advanced "
    "capabilities because this is a release build.\n"
#else
# if !defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
    "WARNING: Function names will not be demangled because "
    "dladdr is not available.\n"
# endif
# if !defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
    "WARNING: Function names will not be demangled "
    "because cxxabi is not available.\n"
# endif
#endif
    ;

  kwsys_ios::ostringstream oss;
#if defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
  void *stackSymbols[256];
  int nFrames=backtrace(stackSymbols,256);
  for (int i=firstFrame; i<nFrames; ++i)
    {
    SymbolProperties symProps;
    symProps.SetReportPath(wholePath);
    symProps.Initialize(stackSymbols[i]);
    oss << symProps << kwsys_ios::endl;
    }
#else
  (void)firstFrame;
  (void)wholePath;
#endif
  programStack += oss.str();

  return programStack;
}